

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::Constraint::isFeasiblePoint
          (Constraint *this,double time,VectorDynSize *state,VectorDynSize *control)

{
  VectorDynSize *this_00;
  double dVar1;
  int iVar2;
  double *pdVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((this->m_isUpperBounded != false) || (bVar4 = true, this->m_isLowerBounded == true)) {
    this_00 = &this->m_valueBuffer;
    iVar2 = (*this->_vptr_Constraint[3])(this,state,control,this_00);
    if ((char)iVar2 == '\0') {
      iDynTree::reportError("Constraint","isFeasiblePoint","Failed to evaluate constraint.");
    }
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      bVar4 = this->m_constraintSize <= uVar6;
      if (this->m_constraintSize <= uVar6) break;
      if (this->m_isLowerBounded == true) {
        pdVar3 = (double *)iDynTree::VectorDynSize::operator()(this_00,uVar6);
        dVar1 = *pdVar3;
        pdVar3 = (double *)iDynTree::VectorDynSize::operator()(&this->m_lowerBound,uVar6);
        if (dVar1 < *pdVar3) {
          return bVar4;
        }
      }
      if (this->m_isUpperBounded == true) {
        pdVar3 = (double *)iDynTree::VectorDynSize::operator()(this_00,uVar6);
        dVar1 = *pdVar3;
        pdVar3 = (double *)iDynTree::VectorDynSize::operator()(&this->m_upperBound,uVar6);
        if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
          return bVar4;
        }
      }
      uVar5 = uVar5 + 1;
    }
  }
  return bVar4;
}

Assistant:

bool Constraint::isFeasiblePoint(double time, const VectorDynSize &state, const VectorDynSize &control)
        {
            if (!m_isUpperBounded && !m_isLowerBounded) {
                return true;
            }

            if (!evaluateConstraint(time, state, control, m_valueBuffer)){
                reportError("Constraint", "isFeasiblePoint", "Failed to evaluate constraint.");
                assert(false);
            }

            for (unsigned int i = 0; i < constraintSize(); ++i){
                if (m_isLowerBounded) {
                    if (m_valueBuffer(i) < m_lowerBound(i)) {
                        return false;
                    }
                }

                if (m_isUpperBounded) {
                    if (m_valueBuffer(i) > m_upperBound(i)) {
                        return false;
                    }
                }
            }
            return true;
        }